

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O3

void Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(OpCode *op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode OVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  bVar2 = OpCodeAttr::IsProfiledOp(*op);
  if (bVar2) {
    OVar4 = *op - ExtendedOpcodePrefix;
    *op = OVar4;
    bVar2 = OpCodeAttr::HasProfiledOp(OVar4);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    error = "(OpCodeAttr::HasProfiledOp(op))";
    message = "OpCodeAttr::HasProfiledOp(op)";
    lineNumber = 0x30;
  }
  else {
    bVar2 = OpCodeAttr::IsProfiledOpWithICIndex(*op);
    if (bVar2) {
      OVar4 = *op;
      *op = OVar4 - MediumLayoutPrefix;
      bVar2 = OpCodeAttr::HasProfiledOpWithICIndex(OVar4 - MediumLayoutPrefix);
      if (bVar2) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      error = "(OpCodeAttr::HasProfiledOpWithICIndex(op))";
      message = "OpCodeAttr::HasProfiledOpWithICIndex(op)";
      lineNumber = 0x35;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      error = "(false)";
      message = "false";
      lineNumber = 0x39;
    }
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                              ,lineNumber,error,message);
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void OpCodeUtil::ConvertNonCallOpToNonProfiled(OpCode& op)
    {
        if (OpCodeAttr::IsProfiledOp(op))
        {
            op -= 1;
            Assert(OpCodeAttr::HasProfiledOp(op));
        }
        else if (OpCodeAttr::IsProfiledOpWithICIndex(op))
        {
            op -= 2;
            Assert(OpCodeAttr::HasProfiledOpWithICIndex(op));
        }
        else
        {
            Assert(false);
        }
    }